

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void opj_image_comp_header_update(opj_image_t *p_image_header,opj_cp *p_cp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  uint a;
  ulong uVar8;
  opj_image_comp_t *poVar9;
  uint a_00;
  uint uVar10;
  uint a_01;
  uint uVar11;
  OPJ_UINT32 a_02;
  
  uVar10 = p_cp->tx0;
  uVar11 = p_cp->ty0;
  a = p_image_header->x0;
  if (p_image_header->x0 < uVar10) {
    a = uVar10;
  }
  a_00 = p_image_header->y0;
  if (p_image_header->y0 < uVar11) {
    a_00 = uVar11;
  }
  uVar2 = p_cp->tdx;
  uVar10 = (p_cp->tw - 1) * uVar2 + uVar10;
  uVar3 = p_cp->tdy;
  uVar11 = (p_cp->th - 1) * uVar3 + uVar11;
  a_01 = uVar10 + uVar2;
  if (CARRY4(uVar10,uVar2)) {
    a_01 = 0xffffffff;
  }
  if (p_image_header->x1 <= a_01) {
    a_01 = p_image_header->x1;
  }
  a_02 = uVar11 + uVar3;
  if (CARRY4(uVar11,uVar3)) {
    a_02 = 0xffffffff;
  }
  if (p_image_header->y1 <= a_02) {
    a_02 = p_image_header->y1;
  }
  poVar9 = p_image_header->comps;
  for (uVar10 = 0; uVar10 < p_image_header->numcomps; uVar10 = uVar10 + 1) {
    OVar4 = opj_uint_ceildiv(a,poVar9->dx);
    OVar5 = opj_uint_ceildiv(a_00,poVar9->dy);
    OVar6 = opj_uint_ceildiv(a_01,poVar9->dx);
    OVar7 = opj_uint_ceildiv(a_02,poVar9->dy);
    bVar1 = (byte)poVar9->factor;
    uVar8 = ~(-1L << (bVar1 & 0x3f));
    poVar9->w = (OPJ_UINT32)((OVar6 - OVar4) + uVar8 >> (bVar1 & 0x3f));
    poVar9->h = (OPJ_UINT32)((OVar7 - OVar5) + uVar8 >> (bVar1 & 0x3f));
    poVar9->x0 = OVar4;
    poVar9->y0 = OVar5;
    poVar9 = poVar9 + 1;
  }
  return;
}

Assistant:

void opj_image_comp_header_update(opj_image_t * p_image_header,
                                  const struct opj_cp * p_cp)
{
    OPJ_UINT32 i, l_width, l_height;
    OPJ_UINT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_UINT32 l_comp_x0, l_comp_y0, l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_x0 = opj_uint_max(p_cp->tx0, p_image_header->x0);
    l_y0 = opj_uint_max(p_cp->ty0, p_image_header->y0);
    l_x1 = p_cp->tx0 + (p_cp->tw - 1U) *
           p_cp->tdx; /* validity of p_cp members used here checked in opj_j2k_read_siz. Can't overflow. */
    l_y1 = p_cp->ty0 + (p_cp->th - 1U) * p_cp->tdy; /* can't overflow */
    l_x1 = opj_uint_min(opj_uint_adds(l_x1, p_cp->tdx),
                        p_image_header->x1); /* use add saturated to prevent overflow */
    l_y1 = opj_uint_min(opj_uint_adds(l_y1, p_cp->tdy),
                        p_image_header->y1); /* use add saturated to prevent overflow */

    l_img_comp = p_image_header->comps;
    for (i = 0; i < p_image_header->numcomps; ++i) {
        l_comp_x0 = opj_uint_ceildiv(l_x0, l_img_comp->dx);
        l_comp_y0 = opj_uint_ceildiv(l_y0, l_img_comp->dy);
        l_comp_x1 = opj_uint_ceildiv(l_x1, l_img_comp->dx);
        l_comp_y1 = opj_uint_ceildiv(l_y1, l_img_comp->dy);
        l_width   = opj_uint_ceildivpow2(l_comp_x1 - l_comp_x0, l_img_comp->factor);
        l_height  = opj_uint_ceildivpow2(l_comp_y1 - l_comp_y0, l_img_comp->factor);
        l_img_comp->w = l_width;
        l_img_comp->h = l_height;
        l_img_comp->x0 = l_comp_x0;
        l_img_comp->y0 = l_comp_y0;
        ++l_img_comp;
    }
}